

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpc_parse_fold(mpc_input_t *i,mpc_fold_t f,int n,mpc_val_t **xs)

{
  mpc_input_t *pmVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  mpc_input_t *pmVar10;
  mpc_val_t *pmVar11;
  int iVar12;
  undefined4 in_register_00000014;
  ulong uVar13;
  
  if (f == mpcf_null) {
    pmVar11 = (mpc_val_t *)0x0;
  }
  else if (f == mpcf_fst) {
    pmVar11 = *xs;
  }
  else if (f == mpcf_snd) {
    pmVar11 = xs[1];
  }
  else {
    if (f != mpcf_trd) {
      if (f == mpcf_fst_free) {
        iVar12 = 0;
      }
      else if (f == mpcf_snd_free) {
        iVar12 = 1;
      }
      else {
        if (f != mpcf_trd_free) {
          if (f == mpcf_strfold) {
            pmVar11 = mpcf_input_strfold(i,n,xs);
            return pmVar11;
          }
          if (f == mpcf_state_ast) {
            pmVar11 = mpcf_input_state_ast(i,(int)xs,(mpc_val_t **)CONCAT44(in_register_00000014,n))
            ;
            return pmVar11;
          }
          if (n < 1) {
            uVar13 = 0;
          }
          else {
            uVar13 = 0;
            do {
              pmVar1 = (mpc_input_t *)xs[uVar13];
              pmVar10 = pmVar1;
              if (pmVar1 < i + 1 && i->mem <= pmVar1) {
                pmVar10 = (mpc_input_t *)malloc(0x40);
                uVar8 = *(undefined4 *)&pmVar1->field_0x4;
                pcVar2 = pmVar1->filename;
                lVar3 = (pmVar1->state).pos;
                lVar4 = (pmVar1->state).row;
                lVar5 = (pmVar1->state).col;
                iVar12 = (pmVar1->state).term;
                uVar9 = *(undefined4 *)&(pmVar1->state).field_0x1c;
                pcVar6 = pmVar1->string;
                pcVar7 = pmVar1->buffer;
                pmVar10->type = pmVar1->type;
                *(undefined4 *)&pmVar10->field_0x4 = uVar8;
                pmVar10->filename = pcVar2;
                (pmVar10->state).pos = lVar3;
                (pmVar10->state).row = lVar4;
                (pmVar10->state).col = lVar5;
                (pmVar10->state).term = iVar12;
                *(undefined4 *)&(pmVar10->state).field_0x1c = uVar9;
                pmVar10->string = pcVar6;
                pmVar10->buffer = pcVar7;
                i->mem_full[(ulong)((long)pmVar1 - (long)i->mem) >> 6] = '\0';
              }
              xs[uVar13] = pmVar10;
              uVar13 = uVar13 + 1;
            } while ((uint)n != uVar13);
          }
          pmVar11 = (*f)((int)uVar13,xs);
          return pmVar11;
        }
        iVar12 = 2;
      }
      pmVar11 = mpcf_input_nth_free(i,n,xs,iVar12);
      return pmVar11;
    }
    pmVar11 = xs[2];
  }
  return pmVar11;
}

Assistant:

static mpc_val_t *mpc_parse_fold(mpc_input_t *i, mpc_fold_t f, int n, mpc_val_t **xs) {
  int j;
  if (f == mpcf_null)      { return mpcf_null(n, xs); }
  if (f == mpcf_fst)       { return mpcf_fst(n, xs); }
  if (f == mpcf_snd)       { return mpcf_snd(n, xs); }
  if (f == mpcf_trd)       { return mpcf_trd(n, xs); }
  if (f == mpcf_fst_free)  { return mpcf_input_fst_free(i, n, xs); }
  if (f == mpcf_snd_free)  { return mpcf_input_snd_free(i, n, xs); }
  if (f == mpcf_trd_free)  { return mpcf_input_trd_free(i, n, xs); }
  if (f == mpcf_strfold)   { return mpcf_input_strfold(i, n, xs); }
  if (f == mpcf_state_ast) { return mpcf_input_state_ast(i, n, xs); }
  for (j = 0; j < n; j++) { xs[j] = mpc_export(i, xs[j]); }
  return f(j, xs);
}